

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  char *__s;
  ulong uVar5;
  CharFormat CVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  bool bVar12;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  CVar6 = PrintCharsAsStringTo<char>((s->_M_dataplus)._M_p,s->_M_string_length,os);
  if ((CVar6 == kAsIs) || (FLAGS_gtest_print_utf8 != '\x01')) {
LAB_0015feca:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
      return;
    }
    goto LAB_00160084;
  }
  __s = (s->_M_dataplus)._M_p;
  uVar5 = s->_M_string_length;
  if (uVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n    As Text: \"",0xf);
    if (__s != (char *)0x0) goto LAB_0016003c;
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    bVar11 = true;
    uVar10 = 1;
    do {
      bVar2 = __s[uVar10 - 1];
      iVar7 = iscntrl((uint)bVar2);
      if ((iVar7 != 0) && ((0xd < bVar2 || ((0x2600U >> (bVar2 & 0x1f) & 1) == 0)))) break;
      bVar11 = uVar10 < uVar5;
      bVar12 = uVar10 != uVar5;
      uVar10 = uVar10 + 1;
    } while (bVar12);
    if (bVar11) goto LAB_0015feca;
    uVar10 = 0;
    do {
      uVar1 = uVar10 + 1;
      bVar2 = __s[uVar10];
      uVar8 = uVar1;
      if ((char)bVar2 < '\0') {
        if (bVar2 < 0xc2) goto LAB_0015feca;
        if (((0xdf < bVar2) || (uVar5 < uVar10 + 2)) || (uVar8 = uVar10 + 2, -0x41 < __s[uVar1])) {
          if ((bVar2 & 0xf0) == 0xe0) {
            uVar8 = uVar10 + 3;
            if ((uVar5 < uVar8) ||
               ((bVar3 = __s[uVar1], -0x41 < (char)bVar3 || (-0x41 < __s[uVar10 + 2]))))
            goto LAB_0015feca;
            if (bVar2 == 0xed) {
              if (0x9f < bVar3) goto LAB_0015feca;
            }
            else if ((bVar2 == 0xe0) && (bVar3 < 0xa0)) goto LAB_0015feca;
          }
          else {
            if (((4 < (byte)(bVar2 + 0x10)) || (uVar8 = uVar10 + 4, uVar5 < uVar8)) ||
               ((bVar3 = __s[uVar1], -0x41 < (char)bVar3 ||
                ((-0x41 < __s[uVar10 + 2] || (-0x41 < __s[uVar10 + 3])))))) goto LAB_0015feca;
            if (bVar2 == 0xf4) {
              if (0x8f < bVar3) goto LAB_0015feca;
            }
            else if ((bVar2 == 0xf0) && (bVar3 < 0x90)) goto LAB_0015feca;
          }
        }
      }
      uVar10 = uVar8;
    } while (uVar8 < uVar5);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n    As Text: \"",0xf);
LAB_0016003c:
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
    return;
  }
LAB_00160084:
  __stack_chk_fail();
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}